

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::RPCCall::Deserialize(RPCCall *this,Parser *parser,RPCCall *call)

{
  RPCCall *parser_00;
  bool bVar1;
  String *pSVar2;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  SymbolTable<flatbuffers::StructDef> *pSVar3;
  Object *pOVar4;
  StructDef *pSVar5;
  string local_98;
  string local_68;
  string local_48;
  RPCCall *local_28;
  RPCCall *call_local;
  Parser *parser_local;
  RPCCall *this_local;
  
  local_28 = call;
  call_local = (RPCCall *)parser;
  parser_local = (Parser *)this;
  pSVar2 = reflection::RPCCall::name(call);
  String::str_abi_cxx11_(&local_48,pSVar2);
  std::__cxx11::string::operator=((string *)this,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  parser_00 = call_local;
  attrs = reflection::RPCCall::attributes(local_28);
  bVar1 = Definition::DeserializeAttributes(&this->super_Definition,(Parser *)parser_00,attrs);
  if (bVar1) {
    documentation = reflection::RPCCall::documentation(local_28);
    anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
    pSVar3 = (SymbolTable<flatbuffers::StructDef> *)(call_local + 0xa8);
    pOVar4 = reflection::RPCCall::request(local_28);
    pSVar2 = reflection::Object::name(pOVar4);
    String::str_abi_cxx11_(&local_68,pSVar2);
    pSVar5 = SymbolTable<flatbuffers::StructDef>::Lookup(pSVar3,&local_68);
    this->request = pSVar5;
    std::__cxx11::string::~string((string *)&local_68);
    pSVar3 = (SymbolTable<flatbuffers::StructDef> *)(call_local + 0xa8);
    pOVar4 = reflection::RPCCall::response(local_28);
    pSVar2 = reflection::Object::name(pOVar4);
    String::str_abi_cxx11_(&local_98,pSVar2);
    pSVar5 = SymbolTable<flatbuffers::StructDef>::Lookup(pSVar3,&local_98);
    this->response = pSVar5;
    std::__cxx11::string::~string((string *)&local_98);
    if ((this->request == (StructDef *)0x0) || (this->response == (StructDef *)0x0)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RPCCall::Deserialize(Parser &parser, const reflection::RPCCall *call) {
  name = call->name()->str();
  if (!DeserializeAttributes(parser, call->attributes())) return false;
  DeserializeDoc(doc_comment, call->documentation());
  request = parser.structs_.Lookup(call->request()->name()->str());
  response = parser.structs_.Lookup(call->response()->name()->str());
  if (!request || !response) { return false; }
  return true;
}